

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

bool __thiscall spvtools::opt::LoopPeeling::IsConditionCheckSideEffectFree(LoopPeeling *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t entry;
  CFG *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  BasicBlock *this_01;
  value_type *__v;
  __node_base _Var4;
  uint32_t condition_block_id;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  blocks_in_path;
  
  this_00 = IRContext::cfg(this->context_);
  if (this->do_while_form_ == false) {
    uVar2 = BasicBlock::id(this->loop_->loop_merge_);
    pvVar3 = CFG::preds(this_00,uVar2);
    condition_block_id =
         *(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start;
    blocks_in_path._M_h._M_buckets = &blocks_in_path._M_h._M_single_bucket;
    blocks_in_path._M_h._M_bucket_count = 1;
    blocks_in_path._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    blocks_in_path._M_h._M_element_count = 0;
    blocks_in_path._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    blocks_in_path._M_h._M_rehash_policy._M_next_resize = 0;
    blocks_in_path._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((__ireturn_type *)&blocks_in_path,
             (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&condition_block_id,__v);
    uVar2 = condition_block_id;
    entry = BasicBlock::id(this->loop_->loop_header_);
    anon_unknown_27::GetBlocksInPath(uVar2,entry,&blocks_in_path,this_00);
    for (_Var4 = blocks_in_path._M_h._M_before_begin; _Var4._M_nxt != (_Hash_node_base *)0x0;
        _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
      this_01 = CFG::block(this_00,*(uint32_t *)&_Var4._M_nxt[1]._M_nxt);
      local_88._8_8_ = 0;
      local_70 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:232:30)>
                 ::_M_invoke;
      local_78 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:232:30)>
                 ::_M_manager;
      local_88._M_unused._M_object = this;
      bVar1 = BasicBlock::WhileEachInst
                        (this_01,(function<bool_(spvtools::opt::Instruction_*)> *)&local_88,false);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      if (!bVar1) {
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&blocks_in_path._M_h);
        return false;
      }
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&blocks_in_path._M_h);
  }
  return true;
}

Assistant:

bool LoopPeeling::IsConditionCheckSideEffectFree() const {
  CFG& cfg = *context_->cfg();

  // The "do-while" form does not cause issues, the algorithm takes into account
  // the first iteration.
  if (!do_while_form_) {
    uint32_t condition_block_id = cfg.preds(loop_->GetMergeBlock()->id())[0];

    std::unordered_set<uint32_t> blocks_in_path;

    blocks_in_path.insert(condition_block_id);
    GetBlocksInPath(condition_block_id, loop_->GetHeaderBlock()->id(),
                    &blocks_in_path, cfg);

    for (uint32_t bb_id : blocks_in_path) {
      BasicBlock* bb = cfg.block(bb_id);
      if (!bb->WhileEachInst([this](Instruction* insn) {
            if (insn->IsBranch()) return true;
            switch (insn->opcode()) {
              case spv::Op::OpLabel:
              case spv::Op::OpSelectionMerge:
              case spv::Op::OpLoopMerge:
                return true;
              default:
                break;
            }
            return context_->IsCombinatorInstruction(insn);
          })) {
        return false;
      }
    }
  }

  return true;
}